

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

bool __thiscall
flow_cutter::MultiCutter::
advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,bool should_skip_non_maximum_sides)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  size_type sVar5;
  MultiCutter *in_RDI;
  undefined8 in_R8;
  byte in_R9B;
  int i_1;
  int best_cutter_id;
  int best_cutter_weight;
  DistanceAwareCutter *x_1;
  iterator __end3;
  iterator __begin3;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *__range3;
  int next_cut_size;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  type x;
  int i;
  int current_cut_size;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *in_stack_ffffffffffffea78;
  undefined4 in_stack_ffffffffffffea80;
  int in_stack_ffffffffffffea84;
  int in_stack_ffffffffffffea88;
  undefined1 in_stack_ffffffffffffea8c;
  undefined1 in_stack_ffffffffffffea8d;
  undefined1 in_stack_ffffffffffffea8e;
  undefined1 in_stack_ffffffffffffea8f;
  DistanceAwareCutter *in_stack_ffffffffffffea90;
  DistanceAwareCutter *graph_00;
  undefined4 in_stack_ffffffffffffeaa0;
  int local_154c;
  int local_1548;
  int local_1544;
  __normal_iterator<flow_cutter::DistanceAwareCutter_*,_std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>_>
  local_1530 [2];
  int local_1520 [4];
  undefined8 local_1510;
  int *local_1508;
  DistanceAwareCutter local_1500;
  int local_3c;
  int local_38;
  byte local_31;
  undefined8 local_30;
  bool local_1;
  
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  iVar2 = Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          ::node_count((Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                        *)0x183615);
  iVar3 = get_current_smaller_cut_side_size(in_RDI);
  if (iVar2 / 2 == iVar3) {
    local_1 = false;
  }
  else {
    std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ::operator[](&in_RDI->cutter_list,(long)in_RDI->current_cutter_id);
    pvVar4 = DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x183658);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    local_38 = (int)sVar5;
    do {
      local_3c = 0;
      while (iVar2 = local_3c,
            sVar5 = std::
                    vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ::size(&in_RDI->cutter_list), iVar2 < (int)sVar5) {
        std::
        vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
        ::operator[](&in_RDI->cutter_list,(long)local_3c);
        graph_00 = &local_1500;
        DistanceAwareCutter::DistanceAwareCutter
                  ((DistanceAwareCutter *)CONCAT44(iVar2,in_stack_ffffffffffffeaa0),graph_00);
        local_1510 = local_30;
        local_1508 = &local_3c;
        bVar1 = DistanceAwareCutter::is_cut_available((DistanceAwareCutter *)0x1836e4);
        in_stack_ffffffffffffeaa0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffeaa0);
        if (bVar1) {
          in_stack_ffffffffffffea90 =
               (DistanceAwareCutter *)
               DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x183704);
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea90);
          if (((int)sVar5 == local_38) &&
             (in_stack_ffffffffffffea8f =
                   DistanceAwareCutter::
                   advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::MultiCutter::advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,bool)::_lambda(int,int,bool,int,int)_1_>
                             ((DistanceAwareCutter *)CONCAT44(iVar2,in_stack_ffffffffffffeaa0),
                              (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                               *)graph_00,(TemporaryData *)in_stack_ffffffffffffea90,
                              (BreadthFirstSearch *)
                              CONCAT17(in_stack_ffffffffffffea8f,
                                       CONCAT16(in_stack_ffffffffffffea8e,
                                                CONCAT15(in_stack_ffffffffffffea8d,
                                                         CONCAT14(in_stack_ffffffffffffea8c,
                                                                  in_stack_ffffffffffffea88)))),
                              (anon_class_16_2_0ed2c766 *)
                              CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80)),
             (bool)in_stack_ffffffffffffea8f)) {
            while (in_stack_ffffffffffffea8e =
                        DistanceAwareCutter::
                        does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::MultiCutter::advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,bool)::_lambda(int,int,bool,int,int)_1_>
                                  (in_stack_ffffffffffffea90,
                                   (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                                    *)CONCAT17(in_stack_ffffffffffffea8f,
                                               CONCAT16(in_stack_ffffffffffffea8e,
                                                        CONCAT15(in_stack_ffffffffffffea8d,
                                                                 CONCAT14(in_stack_ffffffffffffea8c,
                                                                          in_stack_ffffffffffffea88)
                                                                ))),
                                   (anon_class_16_2_0ed2c766 *)
                                   CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80)),
                  ((in_stack_ffffffffffffea8e ^ 0xff) & 1) != 0) {
              in_stack_ffffffffffffea8d =
                   DistanceAwareCutter::
                   advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::MultiCutter::advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>(flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>const&,flow_cutter::TemporaryData&,flow_cutter::BreadthFirstSearch_const&,flow_cutter::PierceNodeScore_const&,bool)::_lambda(int,int,bool,int,int)_1_>
                             ((DistanceAwareCutter *)CONCAT44(iVar2,in_stack_ffffffffffffeaa0),
                              (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                               *)graph_00,(TemporaryData *)in_stack_ffffffffffffea90,
                              (BreadthFirstSearch *)
                              CONCAT17(in_stack_ffffffffffffea8f,
                                       CONCAT16(in_stack_ffffffffffffea8e,
                                                CONCAT15(in_stack_ffffffffffffea8d,
                                                         CONCAT14(in_stack_ffffffffffffea8c,
                                                                  in_stack_ffffffffffffea88)))),
                              (anon_class_16_2_0ed2c766 *)
                              CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80));
              if ((!(bool)in_stack_ffffffffffffea8d) || ((local_31 & 1) == 0)) break;
            }
          }
        }
        std::
        vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
        ::operator[](&in_RDI->cutter_list,(long)local_3c);
        DistanceAwareCutter::operator=
                  (in_stack_ffffffffffffea90,
                   (DistanceAwareCutter *)
                   CONCAT17(in_stack_ffffffffffffea8f,
                            CONCAT16(in_stack_ffffffffffffea8e,
                                     CONCAT15(in_stack_ffffffffffffea8d,
                                              CONCAT14(in_stack_ffffffffffffea8c,
                                                       in_stack_ffffffffffffea88)))));
        DistanceAwareCutter::~DistanceAwareCutter(in_stack_ffffffffffffea90);
        local_3c = local_3c + 1;
      }
      local_1520[0] = std::numeric_limits<int>::max();
      local_1530[0]._M_current =
           (DistanceAwareCutter *)
           std::
           vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
           ::begin(in_stack_ffffffffffffea78);
      std::
      vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>::
      end(in_stack_ffffffffffffea78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<flow_cutter::DistanceAwareCutter_*,_std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffea84,in_stack_ffffffffffffea80),
                                (__normal_iterator<flow_cutter::DistanceAwareCutter_*,_std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>_>
                                 *)in_stack_ffffffffffffea78), bVar1) {
        __gnu_cxx::
        __normal_iterator<flow_cutter::DistanceAwareCutter_*,_std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>_>
        ::operator*(local_1530);
        bVar1 = DistanceAwareCutter::is_cut_available((DistanceAwareCutter *)0x1838a6);
        if (bVar1) {
          pvVar4 = DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x1838b6);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
          min_to<int>(local_1520,(int)sVar5);
        }
        __gnu_cxx::
        __normal_iterator<flow_cutter::DistanceAwareCutter_*,_std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>_>
        ::operator++(local_1530);
      }
      in_stack_ffffffffffffea88 = local_1520[0];
      iVar2 = std::numeric_limits<int>::max();
      if (in_stack_ffffffffffffea88 == iVar2) {
        return false;
      }
      local_1544 = 0;
      local_1548 = -1;
      local_154c = 0;
      while (in_stack_ffffffffffffea84 = local_154c,
            sVar5 = std::
                    vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ::size(&in_RDI->cutter_list), in_stack_ffffffffffffea84 < (int)sVar5) {
        std::
        vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
        ::operator[](&in_RDI->cutter_list,(long)local_154c);
        bVar1 = DistanceAwareCutter::is_cut_available((DistanceAwareCutter *)0x18394c);
        if (bVar1) {
          std::
          vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
          ::operator[](&in_RDI->cutter_list,(long)local_154c);
          pvVar4 = DistanceAwareCutter::get_current_cut((DistanceAwareCutter *)0x183969);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
          if ((int)sVar5 == local_1520[0]) {
            std::
            vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
            ::operator[](&in_RDI->cutter_list,(long)local_154c);
            iVar2 = DistanceAwareCutter::get_current_smaller_cut_side_size
                              ((DistanceAwareCutter *)0x18398e);
            if (local_1544 < iVar2) {
              local_1548 = local_154c;
              std::
              vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ::operator[](&in_RDI->cutter_list,(long)local_154c);
              local_1544 = DistanceAwareCutter::get_current_smaller_cut_side_size
                                     ((DistanceAwareCutter *)0x1839b3);
            }
          }
        }
        local_154c = local_154c + 1;
      }
      local_38 = local_1520[0];
    } while (local_1544 <= in_RDI->current_smaller_side_size);
    in_RDI->current_cutter_id = local_1548;
    std::vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
    ::operator[](&in_RDI->cutter_list,(long)in_RDI->current_cutter_id);
    iVar2 = DistanceAwareCutter::get_current_smaller_cut_side_size((DistanceAwareCutter *)0x183a06);
    in_RDI->current_smaller_side_size = iVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool advance(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node,
        bool should_skip_non_maximum_sides = true)
    {
        if (graph.node_count() / 2 == get_current_smaller_cut_side_size())
            return false;

        int current_cut_size = cutter_list[current_cutter_id].get_current_cut().size();
        for (;;) {
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                auto x = std::move(cutter_list[i]);
                auto my_score_pierce_node = [&](int x, int side,
                                                bool causes_augmenting_path,
                                                int source_dist, int target_dist) {
                    return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                        target_dist, i);
                };
                if (x.is_cut_available()) {
                    if ((int)x.get_current_cut().size() == current_cut_size) {
                        assert(
                            x.does_next_advance_increase_cut(graph, my_score_pierce_node));
                        if (x.advance(graph, tmp, search_algo, my_score_pierce_node)) {
                            assert((int)x.get_current_cut().size() > current_cut_size);
                            while (!x.does_next_advance_increase_cut(graph,
                                my_score_pierce_node)) {
                                if (!x.advance(graph, tmp, search_algo, my_score_pierce_node))
                                    break;
                                if (!should_skip_non_maximum_sides)
                                    break;
                            }
                        }
                    }
                }

                cutter_list[i] = std::move(x);
            }

            int next_cut_size = std::numeric_limits<int>::max();
            for (auto& x : cutter_list)
                if (x.is_cut_available())
                    min_to(next_cut_size, (int)x.get_current_cut().size());

            if (next_cut_size == std::numeric_limits<int>::max())
                return false;

            int best_cutter_weight = 0;
            int best_cutter_id = -1;
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                if (cutter_list[i].is_cut_available()) {
                    if ((int)cutter_list[i].get_current_cut().size() == next_cut_size && cutter_list[i].get_current_smaller_cut_side_size() > best_cutter_weight) {
                        best_cutter_id = i;
                        best_cutter_weight = cutter_list[i].get_current_smaller_cut_side_size();
                    }
                }
            }

            assert(best_cutter_id != -1);

            current_cut_size = next_cut_size;

            if (best_cutter_weight <= current_smaller_side_size)
                continue;

            current_cutter_id = best_cutter_id;
            current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
            return true;
        }
    }